

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NonMaximumSuppression::clear_SuppressionMethod(NonMaximumSuppression *this)

{
  if ((this->_oneof_case_[0] == 1) &&
     ((this->SuppressionMethod_).picktop_ != (NonMaximumSuppression_PickTop *)0x0)) {
    (*(((this->SuppressionMethod_).picktop_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NonMaximumSuppression::clear_SuppressionMethod() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NonMaximumSuppression)
  switch (SuppressionMethod_case()) {
    case kPickTop: {
      delete SuppressionMethod_.picktop_;
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = SUPPRESSIONMETHOD_NOT_SET;
}